

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  Schema *pSVar1;
  void *pvVar2;
  int iVar3;
  VTable **ppVVar4;
  VTable *pVVar5;
  VTable *pVTab;
  HashElem *pHVar6;
  long lVar7;
  
  iVar3 = 0;
  if (db != (sqlite3 *)0x0) {
    iVar3 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar3 == 0) {
      iVar3 = 0x15;
      sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1c396,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      sqlite3BtreeEnterAll(db);
      if (0 < db->nDb) {
        lVar7 = 0;
        do {
          pSVar1 = db->aDb[lVar7].pSchema;
          if (pSVar1 != (Schema *)0x0) {
            for (pHVar6 = (pSVar1->tblHash).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next)
            {
              pvVar2 = pHVar6->data;
              if (((*(byte *)((long)pvVar2 + 0x46) & 0x10) != 0) &&
                 (pVTab = *(VTable **)((long)pvVar2 + 0x58), pVTab != (VTable *)0x0)) {
                if (pVTab->db == db) {
                  ppVVar4 = (VTable **)((long)pvVar2 + 0x58);
                }
                else {
                  do {
                    pVVar5 = pVTab;
                    pVTab = pVVar5->pNext;
                    if (pVTab == (VTable *)0x0) goto LAB_00126ac6;
                  } while (pVTab->db != db);
                  ppVVar4 = &pVVar5->pNext;
                }
                *ppVVar4 = pVTab->pNext;
                sqlite3VtabUnlock(pVTab);
              }
LAB_00126ac6:
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < db->nDb);
      }
      sqlite3BtreeLeaveAll(db);
      callFinaliser(db,0x88);
      if ((forceZombie == 0) && (iVar3 = connectionIsBusy(db), iVar3 != 0)) {
        sqlite3Error(db,5,"unable to close due to unfinalized statements or unfinished backups");
        if (db->mutex == (sqlite3_mutex *)0x0) {
          return 5;
        }
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        return 5;
      }
      db->magic = 0x64cffc7f;
      sqlite3LeaveMutexAndCloseZombie(db);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3Error(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  /* Convert the connection into a zombie and then close it.
  */
  db->magic = SQLITE_MAGIC_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}